

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpapppacket.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPAPPPacket::RTCPAPPPacket(RTCPAPPPacket *this,uint8_t *data,size_t datalength)

{
  byte bVar1;
  size_t sStack_30;
  uint8_t padcount;
  size_t len;
  RTCPCommonHeader *hdr;
  size_t datalength_local;
  uint8_t *data_local;
  RTCPAPPPacket *this_local;
  
  RTCPPacket::RTCPPacket(&this->super_RTCPPacket,APP,data,datalength);
  (this->super_RTCPPacket)._vptr_RTCPPacket = (_func_int **)&PTR__RTCPAPPPacket_00193d38;
  (this->super_RTCPPacket).knownformat = false;
  sStack_30 = datalength;
  if ((*data >> 5 & 1) != 0) {
    bVar1 = data[datalength - 1];
    if ((bVar1 & 3) != 0) {
      return;
    }
    if (datalength <= bVar1) {
      return;
    }
    sStack_30 = datalength - bVar1;
  }
  if (0xb < sStack_30) {
    this->appdatalen = sStack_30 - 0xc;
    (this->super_RTCPPacket).knownformat = true;
  }
  return;
}

Assistant:

RTCPAPPPacket::RTCPAPPPacket(uint8_t *data,size_t datalength)
	: RTCPPacket(APP,data,datalength)
{
	knownformat = false;
	
	RTCPCommonHeader *hdr;
	size_t len = datalength;
	
	hdr = (RTCPCommonHeader *)data;
	if (hdr->padding)
	{
		uint8_t padcount = data[datalength-1];
		if ((padcount & 0x03) != 0) // not a multiple of four! (see rfc 3550 p 37)
			return;
		if (((size_t)padcount) >= len)
			return;
		len -= (size_t)padcount;
	}
	
	if (len < (sizeof(RTCPCommonHeader)+sizeof(uint32_t)*2))
		return;
	len -= (sizeof(RTCPCommonHeader)+sizeof(uint32_t)*2);
	appdatalen = len;
	knownformat = true;
}